

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

void __thiscall
flatbuffers::ToStringVisitor::Field
          (ToStringVisitor *this,size_t param_1,size_t set_idx,ElementaryType param_3,bool param_4,
          TypeTable *param_5,char *name,uint8_t *val)

{
  TypeTable *param_5_local;
  bool param_4_local;
  ElementaryType param_3_local;
  size_t set_idx_local;
  size_t param_1_local;
  ToStringVisitor *this_local;
  
  if (val != (uint8_t *)0x0) {
    if (set_idx != 0) {
      std::__cxx11::string::operator+=((string *)&this->s,",");
      std::__cxx11::string::operator+=((string *)&this->s,(string *)&this->d);
    }
    append_indent(this);
    if (name != (char *)0x0) {
      if ((this->q & 1U) != 0) {
        std::__cxx11::string::operator+=((string *)&this->s,"\"");
      }
      std::__cxx11::string::operator+=((string *)&this->s,name);
      if ((this->q & 1U) != 0) {
        std::__cxx11::string::operator+=((string *)&this->s,"\"");
      }
      std::__cxx11::string::operator+=((string *)&this->s,": ");
    }
  }
  return;
}

Assistant:

void Field(size_t /*field_idx*/, size_t set_idx, ElementaryType /*type*/,
             bool /*is_vector*/, const TypeTable * /*type_table*/,
             const char *name, const uint8_t *val) {
    if (!val) return;
    if (set_idx) {
      s += ",";
      s += d;
    }
    append_indent();
    if (name) {
      if (q) s += "\"";
      s += name;
      if (q) s += "\"";
      s += ": ";
    }
  }